

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernels.hpp
# Opt level: O2

double duckdb::InnerProductOp::Operation<double>(double *lhs_data,double *rhs_data,idx_t count)

{
  idx_t i;
  idx_t iVar1;
  double *rhs_ptr;
  double *lhs_ptr;
  double result;
  
  result = 0.0;
  for (iVar1 = 0; count != iVar1; iVar1 = iVar1 + 1) {
    result = result + lhs_data[iVar1] * rhs_data[iVar1];
  }
  return result;
}

Assistant:

static TYPE Operation(const TYPE *lhs_data, const TYPE *rhs_data, const idx_t count) {

		TYPE result = 0;

		auto lhs_ptr = lhs_data;
		auto rhs_ptr = rhs_data;

		for (idx_t i = 0; i < count; i++) {
			const auto x = *lhs_ptr++;
			const auto y = *rhs_ptr++;
			result += x * y;
		}

		return result;
	}